

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_15::ConsoleReporter::log_contexts(ConsoleReporter *this)

{
  int iVar1;
  IContextScope **ppIVar2;
  ostream *poVar3;
  char *pcVar4;
  int local_24;
  int i;
  IContextScope **contexts;
  int num_contexts;
  ConsoleReporter *this_local;
  
  iVar1 = IReporter::get_num_active_contexts();
  if (iVar1 != 0) {
    ppIVar2 = IReporter::get_active_contexts();
    poVar3 = Color::operator<<(this->s,None);
    std::operator<<(poVar3,"  logged: ");
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      pcVar4 = "          ";
      if (local_24 == 0) {
        pcVar4 = "";
      }
      std::operator<<(this->s,pcVar4);
      (*ppIVar2[local_24]->_vptr_IContextScope[2])(ppIVar2[local_24],this->s);
      std::operator<<(this->s,"\n");
    }
  }
  std::operator<<(this->s,"\n");
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto contexts = get_active_contexts();

                s << Color::None << "  logged: ";
                for(int i = 0; i < num_contexts; ++i) {
                    s << (i == 0 ? "" : "          ");
                    contexts[i]->stringify(&s);
                    s << "\n";
                }
            }

            s << "\n";
        }